

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

void peparse::IterExpVA(parsed_pe_conflict *pe,iterExp cb,void *cbd)

{
  int iVar1;
  list<peparse::exportent,_std::allocator<peparse::exportent>_> *plVar2;
  _List_node_base *p_Var3;
  exportent i;
  exportent local_78;
  
  plVar2 = &pe->internal->exports;
  p_Var3 = (_List_node_base *)plVar2;
  do {
    p_Var3 = (((_List_base<peparse::exportent,_std::allocator<peparse::exportent>_> *)
              &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar2) {
      return;
    }
    exportent::exportent(&local_78,(exportent *)(p_Var3 + 1));
    iVar1 = (*cb)(cbd,local_78.addr,&local_78.moduleName,&local_78.symbolName);
    exportent::~exportent(&local_78);
  } while (iVar1 == 0);
  return;
}

Assistant:

void IterExpVA(parsed_pe *pe, iterExp cb, void *cbd) {
  list<exportent> &l = pe->internal->exports;

  for (exportent i : l) {
    if (cb(cbd, i.addr, i.moduleName, i.symbolName) != 0) {
      break;
    }
  }

  return;
}